

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O0

int absl::lts_20250127::(anonymous_namespace)::ConsumeDigits<10,unsigned_long>
              (char *begin,char *end,int max_digits,unsigned_long *out,bool *dropped_nonzero_digit)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  bool local_62;
  bool local_61;
  char *local_60;
  bool dropped_nonzero;
  unsigned_long digit;
  char *significant_digits_end;
  unsigned_long accumulator;
  char *original_begin;
  bool *dropped_nonzero_digit_local;
  unsigned_long *out_local;
  int max_digits_local;
  char *end_local;
  char *begin_local;
  
  end_local = begin;
  if (0x13 < max_digits) {
    __assert_fail("max_digits <= std::numeric_limits<T>::digits10",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                  ,0xfc,
                  "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
                 );
  }
  while( true ) {
    bVar4 = false;
    if ((*out == 0) && (bVar4 = false, end != end_local)) {
      bVar4 = *end_local == '0';
    }
    if (!bVar4) break;
    end_local = end_local + 1;
  }
  significant_digits_end = (char *)*out;
  local_60 = end;
  if ((long)max_digits < (long)end - (long)end_local) {
    local_60 = end_local + max_digits;
  }
  while( true ) {
    local_61 = false;
    if (end_local < local_60) {
      local_61 = anon_unknown_0::IsDigit<10>(*end_local);
    }
    if (local_61 == false) {
      bVar4 = false;
      while( true ) {
        local_62 = false;
        if (end_local < end) {
          local_62 = anon_unknown_0::IsDigit<10>(*end_local);
        }
        if (local_62 == false) break;
        bVar1 = !bVar4;
        bVar4 = true;
        if (bVar1) {
          bVar4 = *end_local != '0';
        }
        end_local = end_local + 1;
      }
      if ((bVar4) && (dropped_nonzero_digit != (bool *)0x0)) {
        *dropped_nonzero_digit = true;
      }
      *out = (unsigned_long)significant_digits_end;
      return (int)end_local - (int)begin;
    }
    uVar2 = anon_unknown_0::ToDigit<10>(*end_local);
    if ((char *)((long)significant_digits_end * 10) < significant_digits_end) {
      __assert_fail("accumulator * base >= accumulator",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                    ,0x10e,
                    "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
                   );
    }
    uVar3 = (long)significant_digits_end * 10;
    if (uVar3 + uVar2 < uVar3) break;
    significant_digits_end = (char *)(uVar2 + uVar3);
    end_local = end_local + 1;
  }
  __assert_fail("accumulator + digit >= accumulator",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/charconv_parse.cc"
                ,0x110,
                "int absl::lts_20250127::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 10, T = unsigned long]"
               );
}

Assistant:

int ConsumeDigits(const char* begin, const char* end, int max_digits, T* out,
                  bool* dropped_nonzero_digit) {
  if (base == 10) {
    assert(max_digits <= std::numeric_limits<T>::digits10);
  } else if (base == 16) {
    assert(max_digits * 4 <= std::numeric_limits<T>::digits);
  }
  const char* const original_begin = begin;

  // Skip leading zeros, but only if *out is zero.
  // They don't cause an overflow so we don't have to count them for
  // `max_digits`.
  while (!*out && end != begin && *begin == '0') ++begin;

  T accumulator = *out;
  const char* significant_digits_end =
      (end - begin > max_digits) ? begin + max_digits : end;
  while (begin < significant_digits_end && IsDigit<base>(*begin)) {
    // Do not guard against *out overflow; max_digits was chosen to avoid this.
    // Do assert against it, to detect problems in debug builds.
    auto digit = static_cast<T>(ToDigit<base>(*begin));
    assert(accumulator * base >= accumulator);
    accumulator *= base;
    assert(accumulator + digit >= accumulator);
    accumulator += digit;
    ++begin;
  }
  bool dropped_nonzero = false;
  while (begin < end && IsDigit<base>(*begin)) {
    dropped_nonzero = dropped_nonzero || (*begin != '0');
    ++begin;
  }
  if (dropped_nonzero && dropped_nonzero_digit != nullptr) {
    *dropped_nonzero_digit = true;
  }
  *out = accumulator;
  return static_cast<int>(begin - original_begin);
}